

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMCatalogue.hpp
# Opt level: O2

void __thiscall
ROM::Description::Description<char_const*,std::initializer_list<unsigned_int>>
          (Description *this,Name name,string machine_name,string descriptive_name,char *file_names,
          size_t size,initializer_list<unsigned_int> crc32s)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator<char> local_52;
  allocator_type local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->name = name;
  std::__cxx11::string::string((string *)&this->machine_name,(string *)file_names);
  std::__cxx11::string::string((string *)&this->descriptive_name,(string *)size);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,(char *)crc32s._M_array,&local_52);
  __l._M_len = 1;
  __l._M_array = &local_50;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->file_names,__l,&local_51);
  std::__cxx11::string::~string((string *)&local_50);
  this->size = crc32s._M_len;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            (&this->crc32s,(initializer_list<unsigned_int>)machine_name._0_16_,
             (less<unsigned_int> *)&local_50,(allocator_type *)&local_52);
  if (((this->crc32s)._M_t._M_impl.super__Rb_tree_header._M_node_count == 1) &&
     ((this->crc32s)._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color == _S_red)) {
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::clear(&(this->crc32s)._M_t);
  }
  return;
}

Assistant:

Description(
			Name name, std::string machine_name, std::string descriptive_name, FileNameT file_names, size_t size, CRC32T crc32s = uint32_t(0)
		) : name{name}, machine_name{machine_name}, descriptive_name{descriptive_name}, file_names{file_names}, size{size}, crc32s{crc32s} {
			// Slightly lazy: deal with the case where the constructor wasn't provided with any
			// CRCs by spotting that the set has exactly one member, which has value 0. The alternative
			// would be to provide a partial specialisation that never put anything into the set.
			if(this->crc32s.size() == 1 && !*this->crc32s.begin()) {
				this->crc32s.clear();
			}
		}